

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

bool __thiscall
duckdb::ColumnDataCheckpointer::HasChanges(ColumnDataCheckpointer *this,ColumnData *col_data)

{
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var1;
  ulong uVar2;
  bool bVar3;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *this_00;
  const_reference pvVar4;
  ulong __n;
  idx_t start_row;
  ulong uVar5;
  
  this_00 = SegmentTree<duckdb::ColumnSegment,_false>::ReferenceSegments
                      (&(col_data->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
  uVar2 = 0;
  do {
    __n = uVar2;
    uVar5 = (long)(this_00->
                  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                  ).
                  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->
                  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                  ).
                  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar5 <= __n) break;
    pvVar4 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::get<true>(this_00,__n);
    _Var1._M_head_impl =
         (pvVar4->node).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    if ((_Var1._M_head_impl)->segment_type == TRANSIENT) break;
    start_row = *(long *)&(_Var1._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment> -
                (this->row_group->super_SegmentBase<duckdb::RowGroup>).start;
    bVar3 = ColumnData::HasChanges
                      (col_data,start_row,
                       (__int_type)
                       ((atomic<unsigned_long> *)
                       ((long)&(_Var1._M_head_impl)->super_SegmentBase<duckdb::ColumnSegment> + 8))
                       ->super___atomic_base<unsigned_long> + start_row);
    uVar2 = __n + 1;
  } while (!bVar3);
  return __n < uVar5;
}

Assistant:

bool ColumnDataCheckpointer::HasChanges(ColumnData &col_data) {
	auto &nodes = col_data.data.ReferenceSegments();
	for (idx_t segment_idx = 0; segment_idx < nodes.size(); segment_idx++) {
		auto segment = nodes[segment_idx].node.get();
		if (segment->segment_type == ColumnSegmentType::TRANSIENT) {
			// transient segment: always need to write to disk
			return true;
		}
		// persistent segment; check if there were any updates or deletions in this segment
		idx_t start_row_idx = segment->start - row_group.start;
		idx_t end_row_idx = start_row_idx + segment->count;
		if (col_data.HasChanges(start_row_idx, end_row_idx)) {
			return true;
		}
	}
	return false;
}